

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_drawSeg(seg_t *seg,AMColor *color)

{
  int iVar1;
  undefined1 local_38 [8];
  mline_t l;
  AMColor *color_local;
  seg_t *seg_local;
  
  l.b.y = (double)color;
  local_38 = (undefined1  [8])vertex_t::fX(seg->v1);
  l.a.x = vertex_t::fY(seg->v1);
  l.a.y = vertex_t::fX(seg->v2);
  l.b.x = vertex_t::fY(seg->v2);
  iVar1 = FIntCVar::operator_cast_to_int(&am_rotate);
  if (iVar1 != 1) {
    iVar1 = FIntCVar::operator_cast_to_int(&am_rotate);
    if ((iVar1 != 2) || ((viewactive & 1U) == 0)) goto LAB_0042cd2e;
  }
  AM_rotatePoint((double *)local_38,(double *)&l);
  AM_rotatePoint(&l.a.y,&l.b.x);
LAB_0042cd2e:
  AM_drawMline((mline_t *)local_38,(AMColor *)l.b.y);
  return;
}

Assistant:

void AM_drawSeg(seg_t *seg, const AMColor &color)
{
	mline_t l;
	l.a.x = seg->v1->fX();
	l.a.y = seg->v1->fY();
	l.b.x = seg->v2->fX();
	l.b.y = seg->v2->fY();

	if (am_rotate == 1 || (am_rotate == 2 && viewactive))
	{
		AM_rotatePoint (&l.a.x, &l.a.y);
		AM_rotatePoint (&l.b.x, &l.b.y);
	}
	AM_drawMline(&l, color);
}